

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

BP5WriterRec __thiscall
adios2::format::BP5Serializer::CreateWriterRec
          (BP5Serializer *this,void *Variable,char *Name,DataType Type,size_t ElemSize,
          size_t DimCount)

{
  DataType adiosvartype;
  int iVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
  element_size;
  pointer ppVar2;
  size_t sVar3;
  FMFieldList *pp_Var4;
  char *pcVar5;
  Engine *pEVar6;
  size_t sVar7;
  _Alloc_hider *p_Var8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  size_type sVar12;
  int in_ECX;
  undefined1 uVar13;
  void *in_RSI;
  BP5Serializer *in_RDI;
  undefined8 in_R8;
  long in_R9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,__BP5WriterRec>_&&>::value,_pair<iterator,_bool>_>
  _Var14;
  char MMArrayName [40];
  int FieldSize;
  char *ArrayTypeName;
  char *LongName;
  bool NeverMinMax;
  char *ExprString;
  char *OperatorType;
  char *SstName;
  int i_1;
  char *ServerID;
  int IDLength;
  FMFormat Format;
  FMStructDescRec struct_list [4];
  char *Tmp;
  size_t Len;
  size_t i;
  FMField *List;
  StructDefinition *SD;
  VariableStruct *VS;
  char *TextStructID;
  BP5WriterRec Rec;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,__BP5WriterRec>_&&>::value,_pair<iterator,_bool>_>
  obj;
  VariableBase *VB;
  StructDefinition *in_stack_fffffffffffffcf8;
  _BP5WriterRec *in_stack_fffffffffffffd00;
  BP5Serializer *in_stack_fffffffffffffd08;
  BP5Serializer *in_stack_fffffffffffffd10;
  FMFieldList *in_stack_fffffffffffffd18;
  BP5Serializer *in_stack_fffffffffffffd20;
  FMFieldList *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  int local_26c;
  char *local_268;
  char *local_248;
  int local_234;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  StructDefinition *in_stack_fffffffffffffde0;
  StructDefinition *in_stack_fffffffffffffde8;
  char *local_1f8;
  BP5Serializer *local_1f0;
  undefined4 local_1e8;
  undefined8 local_170;
  size_type local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  BP5Serializer *local_158;
  FMFieldList *local_150;
  string local_148 [32];
  FMFieldList *local_128;
  BP5Serializer *local_120;
  StructDefinition *local_118;
  void *local_110;
  void *local_108;
  BP5WriterRec local_100;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
  local_f8;
  undefined1 local_f0;
  _BP5WriterRec local_d8;
  char local_a0 [88];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
  local_48;
  undefined1 local_40;
  void *local_38;
  long local_30;
  undefined8 local_28;
  int local_1c;
  void *local_10;
  
  local_d8.OperatorType = (char *)0x0;
  local_d8.DimCount = 0;
  local_d8.Type = 0;
  local_d8.DataOffset = 0;
  local_d8.MetaOffset = 0;
  local_d8.Key = (void *)0x0;
  local_d8.FieldID = 0;
  local_d8.Shape = Unknown;
  local_d8.MinMaxOffset = 0;
  local_38 = in_RSI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  _BP5WriterRec::_BP5WriterRec(&local_d8);
  pcVar11 = local_a0;
  std::make_pair<std::__cxx11::string_const&,adios2::format::BP5Serializer::_BP5WriterRec>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  _Var14 = std::
           unordered_map<std::__cxx11::string,adios2::format::BP5Serializer::_BP5WriterRec,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::format::BP5Serializer::_BP5WriterRec>>>
           ::insert<std::pair<std::__cxx11::string,adios2::format::BP5Serializer::_BP5WriterRec>>
                     ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>_>_>
                       *)in_stack_fffffffffffffd10,
                      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>
                       *)in_stack_fffffffffffffd08);
  element_size._M_cur =
       (__node_type *)
       _Var14.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_true>
       ._M_cur;
  uVar13 = _Var14.second;
  local_f8._M_cur = element_size._M_cur;
  local_f0 = uVar13;
  local_48._M_cur = element_size._M_cur;
  local_40 = uVar13;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>
           *)0xd10101);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Serializer::_BP5WriterRec>,_false,_true>
                         *)0xd1010e);
  local_100 = &ppVar2->second;
  if (local_1c == 0xe) {
    local_28 = 8;
  }
  local_100->Key = local_10;
  (ppVar2->second).Shape = *(ShapeID *)((long)local_38 + 0x40);
  (ppVar2->second).FieldID = (in_RDI->Info).RecCount;
  (ppVar2->second).DimCount = (int)local_30;
  (ppVar2->second).Type = local_1c;
  (ppVar2->second).OperatorType = (char *)0x0;
  local_108 = (void *)0x0;
  if (local_1c == 0x10) {
    local_110 = local_10;
    local_118 = *(StructDefinition **)((long)local_10 + 0x240);
    if (*(long *)((long)local_10 + 0x248) != 0) {
      local_118 = *(StructDefinition **)((long)local_10 + 0x248);
    }
    sVar3 = core::StructDefinition::Fields((StructDefinition *)0xd10245);
    local_120 = (BP5Serializer *)malloc((sVar3 + 1) * 0x18);
    local_128 = (FMFieldList *)0x0;
    while (in_stack_fffffffffffffd28 = local_128,
          pp_Var4 = (FMFieldList *)core::StructDefinition::Fields((StructDefinition *)0xd10280),
          in_stack_fffffffffffffd28 < pp_Var4) {
      core::StructDefinition::Name_abi_cxx11_
                (in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strdup(pcVar5);
      *(char **)(&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_120->_vptr_BP5Serializer)->_M_dataplus + (long)local_128 * 0x18) = pcVar5;
      std::__cxx11::string::~string(local_148);
      core::StructDefinition::Type
                (in_stack_fffffffffffffde0,
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      pEVar6 = (Engine *)
               TranslateADIOS2Type2FFS
                         (in_stack_fffffffffffffd08,
                          (DataType)((ulong)in_stack_fffffffffffffd00 >> 0x20));
      (&local_120->m_Engine)[(long)local_128 * 3] = pEVar6;
      adiosvartype = core::StructDefinition::Type
                               (in_stack_fffffffffffffde0,
                                CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      iVar1 = TypeElementSize(adiosvartype);
      *(int *)((long)&local_120->m_StatsLevel + (long)local_128 * 0x18) = iVar1;
      sVar3 = core::StructDefinition::Offset
                        (in_stack_fffffffffffffde0,
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      *(int *)(&local_120->field_0x14 + (long)local_128 * 0x18) = (int)sVar3;
      sVar3 = core::StructDefinition::ElementCount
                        (in_stack_fffffffffffffde0,
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      if (sVar3 != 1) {
        sVar7 = strlen((char *)(&local_120->m_Engine)[(long)local_128 * 3]);
        local_150 = (FMFieldList *)(sVar7 + 10);
        in_stack_fffffffffffffd10 = (BP5Serializer *)malloc((size_t)local_150);
        in_stack_fffffffffffffd20 = (BP5Serializer *)(&local_120->m_Engine)[(long)local_128 * 3];
        in_stack_fffffffffffffd18 = local_150;
        local_158 = in_stack_fffffffffffffd10;
        sVar3 = core::StructDefinition::ElementCount
                          (in_stack_fffffffffffffde0,
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        snprintf((char *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd18,"%s[%d]",
                 in_stack_fffffffffffffd20,sVar3 & 0xffffffff);
        free((&local_120->m_Engine)[(long)local_128 * 3]);
        (&local_120->m_Engine)[(long)local_128 * 3] = (Engine *)local_158;
      }
      local_128 = (FMFieldList *)((long)local_128 + 1);
    }
    local_170 = 0;
    local_168 = 0;
    local_160 = 0;
    uStack_15c = 0;
    in_stack_fffffffffffffd08 = local_120;
    sVar3 = core::StructDefinition::Fields((StructDefinition *)0xd104f2);
    p_Var8 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &in_stack_fffffffffffffd08->_vptr_BP5Serializer)->_M_dataplus + sVar3 * 0x18;
    *(undefined8 *)p_Var8 = local_170;
    *(size_type *)(p_Var8 + 8) = local_168;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
      *)(p_Var8 + 0x10))->_M_allocated_capacity = CONCAT44(uStack_15c,local_160);
    memcpy(&local_1f8,&DAT_01134c90,0x80);
    core::StructDefinition::StructName_abi_cxx11_(in_stack_fffffffffffffcf8);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    local_1f8 = strdup(pcVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
    local_1f0 = local_120;
    sVar3 = core::StructDefinition::StructSize(local_118);
    local_1e8 = (undefined4)sVar3;
    uVar9 = register_data_format((in_RDI->Info).LocalFMContext,&local_1f8);
    free_FMfield_list(local_120);
    free(local_1f8);
    lVar10 = get_server_ID_FMformat(uVar9,&stack0xfffffffffffffddc);
    local_108 = malloc((long)(in_stack_fffffffffffffddc * 2 + 1));
    for (local_234 = 0; local_234 < in_stack_fffffffffffffddc; local_234 = local_234 + 1) {
      snprintf((char *)((long)local_108 + (long)(local_234 << 1)),3,"%02x",
               (ulong)*(byte *)(lVar10 + local_234));
    }
    std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::push_back
              ((vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *)
               in_stack_fffffffffffffd10,(value_type *)in_stack_fffffffffffffd08);
  }
  if (local_30 == 0) {
    pcVar11 = BuildVarName(in_RDI,(char *)in_stack_fffffffffffffd28,
                           (ShapeID)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                           (int)in_stack_fffffffffffffd20,
                           (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    AddField(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10,
             (char *)in_stack_fffffffffffffd08,(DataType)((ulong)in_stack_fffffffffffffd00 >> 0x20),
             (int)in_stack_fffffffffffffd00);
    free(pcVar11);
    RecalcMarshalStorageSize(in_stack_fffffffffffffd10);
    local_100->MetaOffset =
         (long)(in_RDI->Info).MetaFields[(in_RDI->Info).MetaFieldCount + -1].field_offset;
    local_100->DataOffset = 0xffffffffffffffff;
    (in_RDI->Info).MetaFormat = (FMFormat)0x0;
  }
  else {
    local_248 = (char *)0x0;
    sVar12 = std::
             vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
             ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                     *)((long)local_38 + 0xd8));
    iVar1 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    if (sVar12 != 0) {
      std::
      vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
      ::operator[]((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                    *)((long)local_38 + 0xd8),0);
      std::__shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xd107bf);
      pcVar5 = (char *)std::__cxx11::string::data();
      local_248 = strdup(pcVar5);
    }
    pcVar11 = BuildLongName(in_stack_fffffffffffffd70,
                            (ShapeID)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                            (int)in_stack_fffffffffffffd68,(size_t)element_size._M_cur,
                            (char *)CONCAT17(uVar13,in_stack_fffffffffffffd58),pcVar11);
    local_268 = "MetaArray";
    local_26c = 0x38;
    sVar12 = std::
             vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
             ::size((vector<std::shared_ptr<adios2::core::Operator>,_std::allocator<std::shared_ptr<adios2::core::Operator>_>_>
                     *)((long)local_38 + 0xd8));
    if (sVar12 != 0) {
      local_268 = "MetaArrayOp";
      local_26c = 0x40;
    }
    if (in_RDI->m_StatsLevel < 1) {
      AddSimpleField(in_RDI,in_stack_fffffffffffffd28,(int *)in_stack_fffffffffffffd20,
                     (char *)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,iVar1);
    }
    else {
      strcat(&stack0xfffffffffffffd68,local_268);
      switch(local_28) {
      case 1:
        strcat(&stack0xfffffffffffffd68,"MM1");
        break;
      case 2:
        strcat(&stack0xfffffffffffffd68,"MM2");
        break;
      case 4:
        strcat(&stack0xfffffffffffffd68,"MM4");
        break;
      case 8:
        strcat(&stack0xfffffffffffffd68,"MM8");
        break;
      case 0x10:
        strcat(&stack0xfffffffffffffd68,"MM16");
      }
      local_100->MinMaxOffset = (long)local_26c;
      AddSimpleField(in_RDI,in_stack_fffffffffffffd28,(int *)in_stack_fffffffffffffd20,
                     (char *)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,iVar1);
    }
    local_100->MetaOffset =
         (long)(in_RDI->Info).MetaFields[(in_RDI->Info).MetaFieldCount + -1].field_offset;
    local_100->OperatorType = local_248;
    free(pcVar11);
    RecalcMarshalStorageSize(in_stack_fffffffffffffd10);
    (in_RDI->Info).MetaFormat = (FMFormat)0x0;
  }
  if (local_108 != (void *)0x0) {
    free(local_108);
  }
  (in_RDI->Info).RecCount = (in_RDI->Info).RecCount + 1;
  return local_100;
}

Assistant:

BP5Serializer::BP5WriterRec BP5Serializer::CreateWriterRec(void *Variable, const char *Name,
                                                           DataType Type, size_t ElemSize,
                                                           size_t DimCount)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
    core::VariableDerived *VD = dynamic_cast<core::VariableDerived *>(VB);
#endif
    auto obj = Info.RecNameMap.insert(std::make_pair(VB->m_Name, _BP5WriterRec()));
    BP5WriterRec Rec = &obj.first->second;
    if (Type == DataType::String)
        ElemSize = sizeof(char *);
    Rec->Key = Variable;
    Rec->Shape = VB->m_ShapeID;
    Rec->FieldID = Info.RecCount;
    Rec->DimCount = (int)DimCount;
    Rec->Type = (int)Type;
    Rec->OperatorType = NULL;
    char *TextStructID = NULL;
    if (Type == DataType::Struct)
    {
        core::VariableStruct *VS = static_cast<core::VariableStruct *>(Variable);
        core::StructDefinition *SD = VS->m_WriteStructDefinition;
        if (VS->m_ReadStructDefinition)
            SD = VS->m_ReadStructDefinition; // Data has been converted to this
        FMField *List = (FMField *)malloc((SD->Fields() + 1) * sizeof(List[0]));
        for (size_t i = 0; i < SD->Fields(); i++)
        {
            List[i].field_name = strdup(SD->Name(i).c_str());
            List[i].field_type = TranslateADIOS2Type2FFS(SD->Type(i));
            List[i].field_size = TypeElementSize(SD->Type(i));
            List[i].field_offset = (int)SD->Offset(i);
            if (SD->ElementCount(i) != 1)
            {
                size_t Len = strlen(List[i].field_type) + 10;
                char *Tmp = (char *)malloc(Len);
                snprintf(Tmp, Len, "%s[%d]", List[i].field_type, (int)SD->ElementCount(i));
                free((void *)List[i].field_type);
                List[i].field_type = Tmp;
            }
        }
        List[SD->Fields()] = {NULL, NULL, 0, 0};

        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = strdup(SD->StructName().c_str());
        struct_list[0].field_list = List;
        struct_list[0].struct_size = (int)SD->StructSize();

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        free_FMfield_list(List);
        free((void *)struct_list[0].format_name);

        int IDLength;
        char *ServerID = get_server_ID_FMformat(Format, &IDLength);
        TextStructID = (char *)malloc(IDLength * 2 + 1);
        for (int i = 0; i < IDLength; i++)
        {
            snprintf(&TextStructID[i * 2], 3, "%02x", ((unsigned char *)ServerID)[i]);
        }
        NewStructFormats.push_back(Format);
    }
    if (DimCount == 0)
    {
        // simple field, only add base value FMField to metadata
        char *SstName = BuildVarName(Name, VB->m_ShapeID, 0,
                                     0); // size and type in full field spec
        AddField(&Info.MetaFields, &Info.MetaFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcMarshalStorageSize();
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->DataOffset = (size_t)-1;
        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    else
    {
        char *OperatorType = NULL;
        if (VB->m_Operations.size())
        {
            OperatorType = strdup((VB->m_Operations[0])->m_TypeString.data());
        }
        // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
        // and Offsets matching _MetaArrayRec
        const char *ExprString = NULL;
        bool NeverMinMax = false;
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        if (VD && (VD->GetDerivedType() != DerivedVarType::StoreData))
            ExprString = VD->m_Expr.ExprString.c_str();
        if (VD && (VD->GetDerivedType() == DerivedVarType::ExpressionString))
            NeverMinMax = true;
#endif
        char *LongName =
            BuildLongName(Name, VB->m_ShapeID, (int)Type, ElemSize, TextStructID, ExprString);

        const char *ArrayTypeName = "MetaArray";
        int FieldSize = sizeof(MetaArrayRec);
        if (VB->m_Operations.size())
        {
            ArrayTypeName = "MetaArrayOp";
            FieldSize = sizeof(MetaArrayRecOperator);
        }
        if ((m_StatsLevel > 0) && !NeverMinMax)
        {
            char MMArrayName[40] = {0};
            strcat(MMArrayName, ArrayTypeName);
            switch (ElemSize)
            {
            case 1:
                strcat(MMArrayName, "MM1");
                break;
            case 2:
                strcat(MMArrayName, "MM2");
                break;
            case 4:
                strcat(MMArrayName, "MM4");
                break;
            case 8:
                strcat(MMArrayName, "MM8");
                break;
            case 16:
                strcat(MMArrayName, "MM16");
                break;
            }
            Rec->MinMaxOffset = FieldSize;
            FieldSize += sizeof(char *);
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, MMArrayName,
                           FieldSize);
        }
        else
        {
            AddSimpleField(&Info.MetaFields, &Info.MetaFieldCount, LongName, ArrayTypeName,
                           FieldSize);
        }
        Rec->MetaOffset = Info.MetaFields[Info.MetaFieldCount - 1].field_offset;
        Rec->OperatorType = OperatorType;
        free(LongName);
        RecalcMarshalStorageSize();

        // Changing the formats renders these invalid
        Info.MetaFormat = NULL;
    }
    if (TextStructID)
        free((void *)TextStructID);
    Info.RecCount++;
    return Rec;
}